

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yang.c
# Opt level: O0

void yang_print_signed(lyout *out,int level,LYEXT_SUBSTMT substmt,uint8_t substmt_index,
                      lys_module *module,lys_ext_instance **ext,uint ext_size,int attr_value)

{
  int iVar1;
  char *local_38;
  char *str;
  lys_ext_instance **ext_local;
  lys_module *module_local;
  LYEXT_SUBSTMT local_18;
  int iStack_14;
  uint8_t substmt_index_local;
  LYEXT_SUBSTMT substmt_local;
  int level_local;
  lyout *out_local;
  
  str = (char *)ext;
  ext_local = (lys_ext_instance **)module;
  module_local._7_1_ = substmt_index;
  local_18 = substmt;
  iStack_14 = level;
  _substmt_local = out;
  iVar1 = asprintf(&local_38,"%d",(ulong)(uint)attr_value,(ulong)ext_size);
  if (iVar1 == -1) {
    ly_log((ly_ctx *)*ext_local,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
           "yang_print_signed");
  }
  else {
    yang_print_substmt(_substmt_local,iStack_14,local_18,module_local._7_1_,local_38,
                       (lys_module *)ext_local,(lys_ext_instance **)str,ext_size);
    free(local_38);
  }
  return;
}

Assistant:

static void
yang_print_signed(struct lyout *out, int level, LYEXT_SUBSTMT substmt, uint8_t substmt_index,
                  const struct lys_module *module, struct lys_ext_instance **ext, unsigned int ext_size,
                  signed int attr_value)
{
    char *str;

    if (asprintf(&str, "%d", attr_value) == -1) {
        LOGMEM(module->ctx);
        return;
    }
    yang_print_substmt(out, level, substmt, substmt_index, str, module, ext, ext_size);
    free(str);
}